

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_encoder.h
# Opt level: O2

void __thiscall draco::MeshEdgebreakerTraversalEncoder::Start(MeshEdgebreakerTraversalEncoder *this)

{
  long *plVar1;
  long lVar2;
  pointer __p;
  pointer this_00;
  long lVar3;
  __uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_> local_38;
  
  RAnsBitEncoder::StartEncoding(&this->start_face_encoder_);
  lVar3 = (long)this->num_attribute_data_;
  if (0 < lVar3) {
    plVar1 = (long *)operator_new__(lVar3 * 0x38 + 8);
    *plVar1 = lVar3;
    lVar2 = 0;
    this_00 = (pointer)(plVar1 + 1);
    do {
      RAnsBitEncoder::RAnsBitEncoder(this_00);
      lVar2 = lVar2 + -0x38;
      this_00 = this_00 + 1;
    } while (lVar3 * -0x38 - lVar2 != 0);
    local_38._M_t.
    super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>.
    super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl =
         (tuple<draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>)
         (_Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>)
         0x0;
    std::__uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>::
    reset((__uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_> *)
          &this->attribute_connectivity_encoders_,(pointer)(plVar1 + 1));
    std::unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_>::
    ~unique_ptr((unique_ptr<draco::RAnsBitEncoder[],_std::default_delete<draco::RAnsBitEncoder[]>_>
                 *)&local_38);
    lVar2 = 0;
    for (lVar3 = 0; lVar3 < this->num_attribute_data_; lVar3 = lVar3 + 1) {
      RAnsBitEncoder::StartEncoding
                ((RAnsBitEncoder *)
                 ((long)&(((this->attribute_connectivity_encoders_)._M_t.
                           super___uniq_ptr_impl<draco::RAnsBitEncoder,_std::default_delete<draco::RAnsBitEncoder[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_draco::RAnsBitEncoder_*,_std::default_delete<draco::RAnsBitEncoder[]>_>
                           .super__Head_base<0UL,_draco::RAnsBitEncoder_*,_false>._M_head_impl)->
                         bit_counts_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + lVar2))
      ;
      lVar2 = lVar2 + 0x38;
    }
  }
  return;
}

Assistant:

void Start() {
    start_face_encoder_.StartEncoding();
    if (num_attribute_data_ > 0) {
      // Init and start arithmetic encoders for storing configuration types
      // of non-position attributes.
      attribute_connectivity_encoders_ = std::unique_ptr<BinaryEncoder[]>(
          new BinaryEncoder[num_attribute_data_]);
      for (int i = 0; i < num_attribute_data_; ++i) {
        attribute_connectivity_encoders_[i].StartEncoding();
      }
    }
  }